

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cVertexAttribBindingTests.cpp
# Opt level: O1

long __thiscall glcts::anon_unknown_0::BasicInputIBase::Setup(BasicInputIBase *this)

{
  undefined8 *puVar1;
  long lVar2;
  
  this->m_po = 0;
  glu::CallLogWrapper::glGenBuffers
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,1,&this->m_xfbo);
  lVar2 = -0x200;
  do {
    puVar1 = (undefined8 *)((long)this->expected_dataui[0].m_data + lVar2);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)&this->instance_count + lVar2);
    *puVar1 = 0;
    puVar1[1] = 0;
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0);
  this->instance_count = 1;
  return 0;
}

Assistant:

virtual long Setup()
	{
		m_po = 0;
		glGenBuffers(1, &m_xfbo);
		for (int i = 0; i < 32; ++i)
		{
			expected_datai[i]  = IVec4(0);
			expected_dataui[i] = UVec4(0);
		}
		instance_count = 1;
		return NO_ERROR;
	}